

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>
                   (string *__return_storage_ptr__,static_string_view *a,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   static_string_view *args,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   static_string_view *args_2,
                   basic_string_view<char,_std::char_traits<char>_> *args_3)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_98;
  size_type local_80;
  pointer local_78;
  undefined8 local_70;
  size_t local_68;
  char *pcStack_60;
  undefined8 local_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  size_t local_38;
  char *pcStack_30;
  undefined8 local_28;
  size_t local_20;
  char *pcStack_18;
  undefined8 local_10;
  
  local_98.first._M_len = (a->super_string_view)._M_len;
  local_98.first._M_str = (a->super_string_view)._M_str;
  local_98.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78 = (b->_M_dataplus)._M_p;
  local_80 = b->_M_string_length;
  local_70 = 0;
  local_68 = (args->super_string_view)._M_len;
  pcStack_60 = (args->super_string_view)._M_str;
  local_58 = 0;
  local_48 = (args_1->_M_dataplus)._M_p;
  local_50 = args_1->_M_string_length;
  local_40 = 0;
  local_38 = (args_2->super_string_view)._M_len;
  pcStack_30 = (args_2->super_string_view)._M_str;
  local_28 = 0;
  local_20 = args_3->_M_len;
  pcStack_18 = args_3->_M_str;
  local_10 = 0;
  views._M_len = 6;
  views._M_array = &local_98;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}